

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_zip.c
# Opt level: O0

void test_compat_zip_6(void)

{
  int iVar1;
  size_t local_28;
  size_t s;
  void *p;
  archive *a;
  char *refname;
  
  a = (archive *)anon_var_dwarf_14651;
  extract_reference_file("test_compat_zip_6.zip");
  s = (size_t)slurpfile(&local_28,"%s",a);
  p = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                   ,L'Ŷ',(uint)((archive *)p != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'ŷ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",p);
  iVar1 = archive_read_support_format_all((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'Ÿ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",p);
  iVar1 = read_open_memory_seek((archive *)p,(void *)s,local_28,7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'Ź',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory_seek(a, p, s, 7)",p);
  compat_zip_6_verify((archive *)p);
  iVar1 = archive_read_free((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'Ż',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",p);
  p = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                   ,L'Ž',(uint)((archive *)p != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'ž',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",p);
  iVar1 = archive_read_support_format_all((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'ſ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",p);
  iVar1 = read_open_memory((archive *)p,(void *)s,local_28,7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'ƀ',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory(a, p, s, 7)",p);
  compat_zip_6_verify((archive *)p);
  iVar1 = archive_read_free((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'Ƃ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",p);
  free((void *)s);
  return;
}

Assistant:

DEFINE_TEST(test_compat_zip_6)
{
	const char *refname = "test_compat_zip_6.zip";
	struct archive *a;
	void *p;
	size_t s;

	extract_reference_file(refname);
	p = slurpfile(&s, "%s", refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, p, s, 7));
	compat_zip_6_verify(a);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory(a, p, s, 7));
	compat_zip_6_verify(a);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
	free(p);
}